

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

SchemaAttDef * __thiscall
xercesc_4_0::TraverseSchema::traverseAnyAttribute(TraverseSchema *this,DOMElement *elem)

{
  short *psVar1;
  short *psVar2;
  short sVar3;
  XMLCh XVar4;
  XMLCh XVar5;
  SchemaInfo *pSVar6;
  ulong uVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  DOMElement *pDVar12;
  XSAnnotation *annotation;
  undefined4 extraout_var;
  short *psVar14;
  undefined4 extraout_var_00;
  XMLCh *pXVar15;
  undefined4 extraout_var_01;
  long lVar16;
  XMLCh *pXVar17;
  SchemaAttDef *this_00;
  ValueVectorOf<unsigned_int> *this_01;
  long lVar18;
  XMLCh *pXVar19;
  ulong uVar20;
  AttTypes type;
  ValueVectorOf<unsigned_int> namespaceList;
  NamespaceScopeManager nsMgr;
  XMLStringTokenizer tokenizer;
  ValueVectorOf<unsigned_int> local_a8;
  DefAttTypes local_7c;
  DatatypeValidator *local_78;
  NamespaceScopeManager local_70;
  XMLStringTokenizer local_60;
  long *plVar13;
  
  pSVar6 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_70.fScopeAdded = false;
  }
  else {
    local_70.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  local_70.fSchemaInfo = pSVar6;
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,elem,3,this,false,this->fNonXSAttList);
  pDVar12 = XUtil::getFirstChildElement(&elem->super_DOMNode);
  pDVar12 = checkContent(this,elem,pDVar12,true,true);
  if (pDVar12 != (DOMElement *)0x0) {
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x54);
  }
  annotation = this->fAnnotation;
  if ((annotation == (XSAnnotation *)0x0 & this->fScanner->fGenerateSyntheticAnnotations) == 1) {
    if (this->fNonXSAttList->fCurCount == 0) {
      annotation = (XSAnnotation *)0x0;
    }
    else {
      annotation = generateSyntheticAnnotation(this,elem,this->fNonXSAttList);
      this->fAnnotation = annotation;
    }
  }
  iVar9 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,SchemaSymbols::fgATT_PROCESSCONTENTS);
  plVar13 = (long *)CONCAT44(extraout_var,iVar9);
  if (plVar13 == (long *)0x0) {
    psVar14 = (short *)0x0;
  }
  else {
    psVar14 = (short *)(**(code **)(*plVar13 + 0x150))(plVar13);
  }
  iVar9 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,SchemaSymbols::fgATT_NAMESPACE);
  plVar13 = (long *)CONCAT44(extraout_var_00,iVar9);
  if (plVar13 == (long *)0x0) {
    pXVar15 = (XMLCh *)0x0;
  }
  else {
    pXVar15 = (XMLCh *)(**(code **)(*plVar13 + 0x150))(plVar13);
  }
  if ((psVar14 != (short *)0x0) &&
     (sVar3 = *psVar14, psVar14 != &SchemaSymbols::fgATTVAL_STRICT && sVar3 != 0)) {
    lVar16 = 0;
    do {
      lVar18 = lVar16;
      if (sVar3 != *(short *)((long)&SchemaSymbols::fgATTVAL_STRICT + lVar18)) goto LAB_0032bd20;
      sVar3 = *(short *)((long)psVar14 + lVar18 + 2);
      lVar16 = lVar18 + 2;
    } while (sVar3 != 0);
    if (*(short *)((long)&DAT_00368864 + lVar18) != 0) {
LAB_0032bd20:
      local_7c = ProcessContents_Skip;
      if (psVar14 == &SchemaSymbols::fgATTVAL_SKIP) goto LAB_0032bc1b;
      lVar16 = 0;
      do {
        psVar1 = (short *)((long)psVar14 + lVar16);
        if (*psVar1 == 0) {
          if (*(short *)((long)&SchemaSymbols::fgATTVAL_SKIP + lVar16) == 0) goto LAB_0032bc1b;
          break;
        }
        psVar2 = (short *)((long)&SchemaSymbols::fgATTVAL_SKIP + lVar16);
        lVar16 = lVar16 + 2;
      } while (*psVar1 == *psVar2);
      if (psVar14 == &SchemaSymbols::fgATTVAL_LAX) {
LAB_0032c040:
        local_7c = ProcessContents_Lax;
        goto LAB_0032bc1b;
      }
      lVar16 = 0;
      do {
        psVar1 = (short *)((long)psVar14 + lVar16);
        if (*psVar1 == 0) {
          local_7c = ProcessContents_Strict;
          if (*(short *)((long)&SchemaSymbols::fgATTVAL_LAX + lVar16) != 0) goto LAB_0032bc1b;
          goto LAB_0032c040;
        }
        psVar2 = (short *)((long)&SchemaSymbols::fgATTVAL_LAX + lVar16);
        lVar16 = lVar16 + 2;
      } while (*psVar1 == *psVar2);
    }
  }
  local_7c = ProcessContents_Strict;
LAB_0032bc1b:
  iVar9 = this->fEmptyNamespaceURI;
  local_a8.fMemoryManager = this->fGrammarPoolMemoryManager;
  local_a8.fCallDestructor = false;
  local_a8.fCurCount = 0;
  local_a8.fMaxCount = 8;
  local_a8.fElemList = (uint *)0x0;
  iVar10 = (*(local_a8.fMemoryManager)->_vptr_MemoryManager[3])();
  local_a8.fElemList = (uint *)CONCAT44(extraout_var_01,iVar10);
  memset(local_a8.fElemList,0,local_a8.fMaxCount << 2);
  type = Any_Any;
  if ((pXVar15 != (XMLCh *)0x0) && (XVar4 = *pXVar15, pXVar15 != L"##any" && XVar4 != L'\0')) {
    lVar16 = 0;
    do {
      lVar18 = lVar16;
      if (XVar4 != *(XMLCh *)((long)&SchemaSymbols::fgATTVAL_TWOPOUNDANY + lVar18))
      goto LAB_0032bcc1;
      XVar4 = *(XMLCh *)((long)pXVar15 + lVar18 + 2);
      lVar16 = lVar18 + 2;
    } while (XVar4 != L'\0');
    if (*(short *)((long)&DAT_0036864e + lVar18) != 0) {
LAB_0032bcc1:
      if (pXVar15 == L"##other") {
LAB_0032bf43:
        iVar9 = this->fTargetNSURI;
        type = Any_Other;
      }
      else {
        lVar16 = 0;
        do {
          psVar14 = (short *)((long)pXVar15 + lVar16);
          if (*psVar14 == 0) {
            if (*(short *)((long)&SchemaSymbols::fgATTVAL_TWOPOUNDOTHER + lVar16) == 0)
            goto LAB_0032bf43;
            break;
          }
          psVar1 = (short *)((long)&SchemaSymbols::fgATTVAL_TWOPOUNDOTHER + lVar16);
          lVar16 = lVar16 + 2;
        } while (*psVar14 == *psVar1);
        XMLStringTokenizer::XMLStringTokenizer(&local_60,pXVar15,this->fGrammarPoolMemoryManager);
        local_78 = DatatypeValidatorFactory::getDatatypeValidator(this->fDatatypeRegistry,L"anyURI")
        ;
LAB_0032bdde:
        bVar8 = XMLStringTokenizer::hasMoreTokens(&local_60);
        if (bVar8) {
          pXVar15 = XMLStringTokenizer::nextToken(&local_60);
          if (pXVar15 == L"##local") {
LAB_0032be59:
            uVar11 = this->fEmptyNamespaceURI;
          }
          else {
            pXVar17 = L"##local";
            if (pXVar15 == (XMLCh *)0x0) {
LAB_0032be26:
              if (*pXVar17 == L'\0') goto LAB_0032be59;
            }
            else {
              pXVar17 = L"##local";
              pXVar19 = pXVar15;
              do {
                XVar4 = *pXVar19;
                if (XVar4 == L'\0') goto LAB_0032be26;
                pXVar19 = pXVar19 + 1;
                XVar5 = *pXVar17;
                pXVar17 = pXVar17 + 1;
              } while (XVar4 == XVar5);
            }
            if (pXVar15 == L"##targetNamespace") {
LAB_0032be99:
              uVar11 = this->fTargetNSURI;
            }
            else {
              pXVar17 = L"##targetNamespace";
              if (pXVar15 == (XMLCh *)0x0) {
LAB_0032be5f:
                if (*pXVar17 == L'\0') goto LAB_0032be99;
              }
              else {
                pXVar17 = L"##targetNamespace";
                pXVar19 = pXVar15;
                do {
                  XVar4 = *pXVar19;
                  if (XVar4 == L'\0') goto LAB_0032be5f;
                  pXVar19 = pXVar19 + 1;
                  XVar5 = *pXVar17;
                  pXVar17 = pXVar17 + 1;
                } while (XVar4 == XVar5);
              }
              (*(local_78->super_XSerializable)._vptr_XSerializable[8])
                        (local_78,pXVar15,this->fSchemaInfo->fValidationContext,this->fMemoryManager
                        );
              uVar11 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                                 (this->fURIStringPool,pXVar15);
            }
          }
          if (local_a8.fCurCount != 0) goto code_r0x0032bea7;
          goto LAB_0032bed3;
        }
        iVar9 = this->fEmptyNamespaceURI;
        XMLStringTokenizer::~XMLStringTokenizer(&local_60);
        type = Any_List;
      }
    }
  }
  this_00 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
  SchemaAttDef::SchemaAttDef(this_00,L"",L"",iVar9,type,local_7c,this->fGrammarPoolMemoryManager);
  if (annotation != (XSAnnotation *)0x0) {
    SchemaGrammar::putAnnotation(this->fSchemaGrammar,this_00,annotation);
  }
  if (local_a8.fCurCount != 0) {
    if (this_00->fNamespaceList == (ValueVectorOf<unsigned_int> *)0x0) {
      this_01 = (ValueVectorOf<unsigned_int> *)
                XMemory::operator_new(0x28,(this_00->super_XMLAttDef).fMemoryManager);
      ValueVectorOf<unsigned_int>::ValueVectorOf(this_01,&local_a8);
      this_00->fNamespaceList = this_01;
    }
    else {
      ValueVectorOf<unsigned_int>::operator=(this_00->fNamespaceList,&local_a8);
    }
  }
  (*(local_a8.fMemoryManager)->_vptr_MemoryManager[4])(local_a8.fMemoryManager,local_a8.fElemList);
  NamespaceScopeManager::~NamespaceScopeManager(&local_70);
  return this_00;
code_r0x0032bea7:
  if (*local_a8.fElemList != uVar11) {
    uVar7 = 1;
    do {
      uVar20 = uVar7;
      if (local_a8.fCurCount == uVar20) break;
      uVar7 = uVar20 + 1;
    } while (local_a8.fElemList[uVar20] != uVar11);
    if (local_a8.fCurCount <= uVar20) {
LAB_0032bed3:
      ValueVectorOf<unsigned_int>::ensureExtraCapacity(&local_a8,1);
      local_a8.fElemList[local_a8.fCurCount] = uVar11;
      local_a8.fCurCount = local_a8.fCurCount + 1;
    }
  }
  goto LAB_0032bdde;
}

Assistant:

SchemaAttDef* TraverseSchema::traverseAnyAttribute(const DOMElement* const elem) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    // -----------------------------------------------------------------------
    // Check Attributes
    // -----------------------------------------------------------------------
    fAttributeCheck.checkAttributes(
        elem, GeneralAttributeCheck::E_AnyAttribute, this, false, fNonXSAttList
    );

    // ------------------------------------------------------------------
    // First, handle any ANNOTATION declaration
    // ------------------------------------------------------------------
    if (checkContent(elem, XUtil::getFirstChildElement(elem), true) != 0) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AnyAttributeContentError);
    }
    if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
    }
    Janitor<XSAnnotation> janAnnot(fAnnotation);
    // ------------------------------------------------------------------
    // Get attributes
    // ------------------------------------------------------------------
    const XMLCh* const processContents = getElementAttValue(elem, SchemaSymbols::fgATT_PROCESSCONTENTS);
    const XMLCh* const nameSpace = getElementAttValue(elem, SchemaSymbols::fgATT_NAMESPACE);

    // ------------------------------------------------------------------
    // Set default att type based on 'processContents' value
    // ------------------------------------------------------------------
    XMLAttDef::DefAttTypes attDefType = XMLAttDef::ProcessContents_Strict;

    if ((!processContents || !*processContents)
        || XMLString::equals(processContents, SchemaSymbols::fgATTVAL_STRICT)) {
        // Do nothing - defaulted already
    }
    else if (XMLString::equals(processContents, SchemaSymbols::fgATTVAL_SKIP)) {
        attDefType = XMLAttDef::ProcessContents_Skip;
    }
    else if (XMLString::equals(processContents, SchemaSymbols::fgATTVAL_LAX)) {
        attDefType = XMLAttDef::ProcessContents_Lax;
    }

    // ------------------------------------------------------------------
    // Process 'namespace' attribute
    // ------------------------------------------------------------------
    int uriIndex = fEmptyNamespaceURI;
    XMLAttDef::AttTypes attType = XMLAttDef::Any_Any;
    ValueVectorOf<unsigned int> namespaceList(8, fGrammarPoolMemoryManager);

    if ((!nameSpace || !*nameSpace)
        || XMLString::equals(nameSpace, SchemaSymbols::fgATTVAL_TWOPOUNDANY)) {
        // Do nothing - defaulted already
    }
    else if (XMLString::equals(nameSpace, SchemaSymbols::fgATTVAL_TWOPOUNDOTHER)) {

        attType = XMLAttDef::Any_Other;
        uriIndex = fTargetNSURI;
    }
    else {

        XMLStringTokenizer tokenizer(nameSpace, fGrammarPoolMemoryManager);
        DatatypeValidator* anyURIDV = fDatatypeRegistry->getDatatypeValidator(SchemaSymbols::fgDT_ANYURI);

        attType = XMLAttDef::Any_List;

        while (tokenizer.hasMoreTokens()) {

            const XMLCh* token = tokenizer.nextToken();

            if (XMLString::equals(token, SchemaSymbols::fgATTVAL_TWOPOUNDLOCAL)) {
                uriIndex = fEmptyNamespaceURI;
            }
            else if (XMLString::equals(token, SchemaSymbols::fgATTVAL_TWOPOUNDTRAGETNAMESPACE)) {
                uriIndex = fTargetNSURI;
            }
            else {

                try {
                    anyURIDV->validate(token
                                     , fSchemaInfo->getValidationContext()
                                     , fMemoryManager);
                }
                catch(const XMLException& excep) {
                    reportSchemaError(elem, excep);
                }
                uriIndex = fURIStringPool->addOrFind(token);
            }

            if (!namespaceList.containsElement(uriIndex)) {
                namespaceList.addElement(uriIndex);
            }
        }

        uriIndex = fEmptyNamespaceURI;
    }

    // ------------------------------------------------------------------
    // Create wildcard attribute
    // ------------------------------------------------------------------
    SchemaAttDef* attDef = new (fGrammarPoolMemoryManager) SchemaAttDef(XMLUni::fgZeroLenString,
                                            XMLUni::fgZeroLenString,
                                            uriIndex, attType, attDefType,
                                            fGrammarPoolMemoryManager);

    if (!janAnnot.isDataNull())
        fSchemaGrammar->putAnnotation(attDef, janAnnot.release());

    if (namespaceList.size()) {
       attDef->setNamespaceList(&namespaceList);
    }

    return attDef;
}